

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O3

void __thiscall QHttpNetworkConnectionChannel::allDone(QHttpNetworkConnectionChannel *this)

{
  undefined8 uVar1;
  long *plVar2;
  bool bVar3;
  bool bVar4;
  ConnectionType CVar5;
  SocketState SVar6;
  QSlotObjectBase *pQVar7;
  QHttp2ProtocolHandler *pQVar8;
  long lVar9;
  int in_ESI;
  QIODevice *pQVar10;
  QHttp2ProtocolHandler *pQVar11;
  QObject *pQVar12;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 getState;
  QUrl local_50;
  value_type local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x38) == 0) {
    allDone();
    goto LAB_002069bf;
  }
  CVar5 = QHttpNetworkConnection::connectionType(*(QHttpNetworkConnection **)(this + 0xf8));
  if (((CVar5 == ConnectionTypeHTTP2) && (this[0x18] == (QHttpNetworkConnectionChannel)0x0)) &&
     (this[0x88] == (QHttpNetworkConnectionChannel)0x0)) {
    bVar3 = Http2::is_protocol_upgraded(*(QHttpNetworkReply **)(this + 0x38));
    if (!bVar3) {
      in_ESI = 0;
      QHttpNetworkConnection::setConnectionType
                (*(QHttpNetworkConnection **)(this + 0xf8),ConnectionTypeHTTP);
      *(undefined4 *)(*(long *)(*(long *)(this + 0xf8) + 8) + 0xa0) =
           *(undefined4 *)(*(long *)(*(long *)(this + 0xf8) + 8) + 0xa4);
      goto LAB_0020670e;
    }
    this[0x88] = (QHttpNetworkConnectionChannel)0x1;
    QAbstractProtocolHandler::setReply
              (*(QAbstractProtocolHandler **)(this + 0x78),(QHttpNetworkReply *)0x0);
    uVar1 = *(undefined8 *)(this + 0x78);
    *(undefined8 *)(this + 0x78) = 0;
    local_48.first.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader = (_func_int **)0x0;
    local_48.first.d.d.ptr =
         (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)(QHttpNetworkRequestPrivate *)0x0;
    local_48.second = (QHttpNetworkReply *)&QtPrivate::QMetaTypeInterfaceWrapper<void>::metaType;
    pQVar7 = (QSlotObjectBase *)operator_new(0x18);
    (pQVar7->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 1;
    pQVar7->m_impl =
         QtPrivate::
         QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/access/qhttpnetworkconnectionchannel.cpp:486:45),_QtPrivate::List<>,_void>
         ::impl;
    *(undefined8 *)(pQVar7 + 1) = uVar1;
    QMetaObject::invokeMethodImpl
              ((QObject *)this,pQVar7,QueuedConnection,1,(void **)&local_48,
               (char **)&local_48.first.d,(QMetaTypeInterface **)&local_48.second);
    QHttpNetworkConnection::fillHttp2Queue(*(QHttpNetworkConnection **)(this + 0xf8));
    pQVar8 = (QHttp2ProtocolHandler *)operator_new(0x58);
    QHttp2ProtocolHandler::QHttp2ProtocolHandler(pQVar8,(QHttpNetworkConnectionChannel *)this);
    pQVar8 = pQVar8 + 0x10;
    plVar2 = *(long **)(this + 0x78);
    *(QHttp2ProtocolHandler **)(this + 0x78) = pQVar8;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
      pQVar8 = *(QHttp2ProtocolHandler **)(this + 0x78);
    }
    pQVar11 = pQVar8 + -0x10;
    if (pQVar8 == (QHttp2ProtocolHandler *)0x0) {
      pQVar11 = (QHttp2ProtocolHandler *)0x0;
    }
    local_48.first.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader = (_func_int **)0x0;
    local_48.first.d.d.ptr =
         (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)(QHttpNetworkRequestPrivate *)0x0;
    local_48.second = (QHttpNetworkReply *)0x0;
    QMetaObject::invokeMethodImpl
              ((QObject *)pQVar11,"_q_receiveReply",QueuedConnection,1,(void **)&local_48,
               (char **)&local_48.first.d,(QMetaTypeInterface **)&local_48.second);
    if ((*(long *)(this + 0xf0) == 0) || (*(int *)(*(long *)(this + 0xf0) + 4) == 0)) {
      pQVar12 = (QObject *)0x0;
    }
    else {
      pQVar12 = *(QObject **)(this + 0xf8);
    }
  }
  else {
LAB_0020670e:
    bVar3 = QHttpNetworkReplyPrivate::shouldEmitSignals
                      (*(QHttpNetworkReplyPrivate **)(*(long *)(this + 0x38) + 8));
    bVar4 = QHttpNetworkReplyPrivate::isConnectionCloseEnabled
                      (*(QHttpNetworkReplyPrivate **)(*(long *)(this + 0x38) + 8));
    detectPipeliningSupport(this);
    handleStatus(this);
    if (*(QObject **)(this + 0x38) != (QObject *)0x0 && bVar3) {
      local_48.first.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader = (_func_int **)0x0;
      local_48.first.d.d.ptr =
           (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)(QHttpNetworkRequestPrivate *)0x0;
      local_48.second = (QHttpNetworkReply *)0x0;
      in_ESI = 0x26bf60;
      QMetaObject::invokeMethodImpl
                (*(QObject **)(this + 0x38),"finished",QueuedConnection,1,(void **)&local_48,
                 (char **)&local_48.first.d,(QMetaTypeInterface **)&local_48.second);
    }
    *(undefined4 *)(this + 0x5c) = 3;
    if (*(int *)(this + 0x20) != 0x10) {
      *(undefined4 *)(this + 0x20) = 0;
    }
    if (this[0x50] == (QHttpNetworkConnectionChannel)0x0) {
      QUrl::QUrl(&local_50);
      QHttpNetworkRequest::QHttpNetworkRequest(&local_48.first,&local_50,Get,NormalPriority);
      QHttpNetworkRequest::operator=((QHttpNetworkRequest *)(this + 0x28),&local_48.first);
      QHttpNetworkRequest::~QHttpNetworkRequest(&local_48.first);
      QUrl::~QUrl(&local_50);
      *(undefined8 *)(this + 0x38) = 0;
      in_ESI = 0;
      QAbstractProtocolHandler::setReply
                (*(QAbstractProtocolHandler **)(this + 0x78),(QHttpNetworkReply *)0x0);
    }
    if (*(long *)(this + 200) != 0) {
      if (!bVar4 && this[0x50] == (QHttpNetworkConnectionChannel)0x0) {
        pQVar10 = *(QIODevice **)(this + 0x10);
        local_48.first.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader._0_1_ = 0xaa;
        SVar6 = QSocketAbstraction::
                visit<QSocketAbstraction::socketState(QIODevice*)::_lambda(auto:1*)_1_&>
                          ((anon_class_1_0_00000001 *)&local_48,pQVar10);
        in_ESI = (int)pQVar10;
        if (SVar6 == ConnectedState) {
          local_48.second = (QHttpNetworkReply *)&DAT_aaaaaaaaaaaaaaaa;
          local_48.first.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader =
               (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
          local_48.first.d.d.ptr =
               (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
          QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::takeFirst
                    (&local_48,
                     (QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)(this + 0xb8));
          QHttpNetworkRequest::operator=((QHttpNetworkRequest *)(this + 0x28),&local_48.first);
          *(QHttpNetworkReply **)(this + 0x38) = local_48.second;
          QAbstractProtocolHandler::setReply
                    (*(QAbstractProtocolHandler **)(this + 0x78),local_48.second);
          *(undefined4 *)(this + 0x20) = 8;
          *(undefined8 *)(this + 0x40) = 0;
          *(undefined8 *)(this + 0x48) = 0;
          this[0x50] = (QHttpNetworkConnectionChannel)0x0;
          QHttpNetworkConnectionPrivate::fillPipeline
                    (*(QHttpNetworkConnectionPrivate **)(*(long *)(this + 0xf8) + 8),
                     *(QIODevice **)(this + 0x10));
          QHttpNetworkRequest::~QHttpNetworkRequest(&local_48.first);
          goto LAB_002069bf;
        }
      }
      requeueCurrentlyPipelinedRequests(this);
      close(this,in_ESI);
      goto LAB_002069bf;
    }
    lVar9 = (**(code **)(**(long **)(this + 0x10) + 0xa0))();
    if (lVar9 < 1) {
      if (*(long *)(this + 200) != 0) goto LAB_002069bf;
      if (bVar4) {
        pQVar10 = *(QIODevice **)(this + 0x10);
        local_48.first.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader._0_1_ = 0xaa;
        SVar6 = QSocketAbstraction::
                visit<QSocketAbstraction::socketState(QIODevice*)::_lambda(auto:1*)_1_&>
                          ((anon_class_1_0_00000001 *)&local_48,pQVar10);
        if (SVar6 != UnconnectedState) {
          close(this,(int)pQVar10);
        }
      }
      lVar9 = QMetaObject::cast((QObject *)&QHttpNetworkConnection::staticMetaObject);
      if (lVar9 == 0) goto LAB_002069bf;
    }
    else {
      close(this,in_ESI);
    }
    if ((*(long *)(this + 0xf0) == 0) || (*(int *)(*(long *)(this + 0xf0) + 4) == 0)) {
      pQVar12 = (QObject *)0x0;
    }
    else {
      pQVar12 = *(QObject **)(this + 0xf8);
    }
  }
  local_48.second = (QHttpNetworkReply *)0x0;
  local_48.first.d.d.ptr =
       (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)(QHttpNetworkRequestPrivate *)0x0;
  local_48.first.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader = (_func_int **)0x0;
  QMetaObject::invokeMethodImpl
            (pQVar12,"_q_startNextRequest",QueuedConnection,1,(void **)&local_48,
             (char **)&local_48.first.d,(QMetaTypeInterface **)&local_48.second);
LAB_002069bf:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpNetworkConnectionChannel::allDone()
{
    Q_ASSERT(reply);

    if (!reply) {
        qWarning("QHttpNetworkConnectionChannel::allDone() called without reply. Please report at http://bugreports.qt.io/");
        return;
    }

    // For clear text HTTP/2 we tried to upgrade from HTTP/1.1 to HTTP/2; for
    // ConnectionTypeHTTP2Direct we can never be here in case of failure
    // (after an attempt to read HTTP/1.1 as HTTP/2 frames) or we have a normal
    // HTTP/2 response and thus can skip this test:
    if (connection->connectionType() == QHttpNetworkConnection::ConnectionTypeHTTP2
        && !ssl && !switchedToHttp2) {
        if (Http2::is_protocol_upgraded(*reply)) {
            switchedToHttp2 = true;
            protocolHandler->setReply(nullptr);

            // As allDone() gets called from the protocol handler, it's not yet
            // safe to delete it. There is no 'deleteLater', since
            // QAbstractProtocolHandler is not a QObject. Instead delete it in
            // a queued emission.

            QMetaObject::invokeMethod(this, [oldHandler = std::move(protocolHandler)]() mutable {
                oldHandler.reset();
            }, Qt::QueuedConnection);

            connection->fillHttp2Queue();
            protocolHandler.reset(new QHttp2ProtocolHandler(this));
            QHttp2ProtocolHandler *h2c = static_cast<QHttp2ProtocolHandler *>(protocolHandler.get());
            QMetaObject::invokeMethod(h2c, "_q_receiveReply", Qt::QueuedConnection);
            QMetaObject::invokeMethod(connection, "_q_startNextRequest", Qt::QueuedConnection);
            return;
        } else {
            // Ok, whatever happened, we do not try HTTP/2 anymore ...
            connection->setConnectionType(QHttpNetworkConnection::ConnectionTypeHTTP);
            connection->d_func()->activeChannelCount = connection->d_func()->channelCount;
        }
    }

    // while handling 401 & 407, we might reset the status code, so save this.
    bool emitFinished = reply->d_func()->shouldEmitSignals();
    bool connectionCloseEnabled = reply->d_func()->isConnectionCloseEnabled();
    detectPipeliningSupport();

    handleStatus();
    // handleStatus() might have removed the reply because it already called connection->emitReplyError()

    // queue the finished signal, this is required since we might send new requests from
    // slot connected to it. The socket will not fire readyRead signal, if we are already
    // in the slot connected to readyRead
    if (reply && emitFinished)
        QMetaObject::invokeMethod(reply, "finished", Qt::QueuedConnection);


    // reset the reconnection attempts after we receive a complete reply.
    // in case of failures, each channel will attempt two reconnects before emitting error.
    reconnectAttempts = reconnectAttemptsDefault;

    // now the channel can be seen as free/idle again, all signal emissions for the reply have been done
    if (state != QHttpNetworkConnectionChannel::ClosingState)
        state = QHttpNetworkConnectionChannel::IdleState;

    // if it does not need to be sent again we can set it to 0
    // the previous code did not do that and we had problems with accidental re-sending of a
    // finished request.
    // Note that this may trigger a segfault at some other point. But then we can fix the underlying
    // problem.
    if (!resendCurrent) {
        request = QHttpNetworkRequest();
        reply = nullptr;
        protocolHandler->setReply(nullptr);
    }

    // move next from pipeline to current request
    if (!alreadyPipelinedRequests.isEmpty()) {
        if (resendCurrent || connectionCloseEnabled || QSocketAbstraction::socketState(socket) != QAbstractSocket::ConnectedState) {
            // move the pipelined ones back to the main queue
            requeueCurrentlyPipelinedRequests();
            close();
        } else {
            // there were requests pipelined in and we can continue
            HttpMessagePair messagePair = alreadyPipelinedRequests.takeFirst();

            request = messagePair.first;
            reply = messagePair.second;
            protocolHandler->setReply(messagePair.second);
            state = QHttpNetworkConnectionChannel::ReadingState;
            resendCurrent = false;

            written = 0; // message body, excluding the header, irrelevant here
            bytesTotal = 0; // message body total, excluding the header, irrelevant here

            // pipeline even more
            connection->d_func()->fillPipeline(socket);

            // continue reading
            //_q_receiveReply();
            // this was wrong, allDone gets called from that function anyway.
        }
    } else if (alreadyPipelinedRequests.isEmpty() && socket->bytesAvailable() > 0) {
        // this is weird. we had nothing pipelined but still bytes available. better close it.
        close();

        QMetaObject::invokeMethod(connection, "_q_startNextRequest", Qt::QueuedConnection);
    } else if (alreadyPipelinedRequests.isEmpty()) {
        if (connectionCloseEnabled)
            if (QSocketAbstraction::socketState(socket) != QAbstractSocket::UnconnectedState)
                close();
        if (qobject_cast<QHttpNetworkConnection*>(connection))
            QMetaObject::invokeMethod(connection, "_q_startNextRequest", Qt::QueuedConnection);
    }
}